

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O1

void __thiscall
sqlcheck::TestSuite_JoinEqualityTest_Test::~TestSuite_JoinEqualityTest_Test
          (TestSuite_JoinEqualityTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, JoinEqualityTest) {
    Configuration default_conf;
    default_conf.testing_mode = true;
    default_conf.verbose = false;

    std::unique_ptr<std::istringstream> stream(new std::istringstream());
    stream->str(
            "SELECT baz.id\n"
            "FROM foo\n"
            "LEFT JOIN bar ON bar\n"
            "JOIN baz ON baz = foo.baz;"
    );

    default_conf.test_stream.reset(stream.release());

    Check(default_conf);

}